

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

PolicyFunctions *
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
::GetPolicyFunctions(void)

{
  return &GetPolicyFunctions::value;
}

Assistant:

static const PolicyFunctions& GetPolicyFunctions() {
    static constexpr PolicyFunctions value = {
        sizeof(slot_type),
        // TODO(b/328722020): try to type erase
        // for standard layout and alignof(Hash) <= alignof(CommonFields).
        std::is_empty<hasher>::value ? &GetHashRefForEmptyHasher
                                     : &raw_hash_set::get_hash_ref_fn,
        PolicyTraits::template get_hash_slot_fn<hasher>(),
        PolicyTraits::transfer_uses_memcpy()
            ? TransferRelocatable<sizeof(slot_type)>
            : &raw_hash_set::transfer_slot_fn,
        (std::is_same<SlotAlloc, std::allocator<slot_type>>::value
             ? &DeallocateStandard<alignof(slot_type)>
             : &raw_hash_set::dealloc_fn),
        &raw_hash_set::resize_impl,
    };
    return value;
  }